

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::checkTorsions(FragmentStamp *this)

{
  undefined8 uVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  _Tuple_impl<2UL,_int,_int> _Var5;
  bool bVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  pointer piVar9;
  pointer ppTVar10;
  iterator iVar11;
  ostream *poVar12;
  OpenMDException *pOVar13;
  int __tmp;
  pointer ppTVar14;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  long lVar15;
  ulong uVar16;
  int ghostIndex;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allTorsions;
  vector<int,_std::allocator<int>_> torsionAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  key_type local_1d8;
  _Bind<std::less<int>_(std::_Placeholder<1>,_int)> local_1c0;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  lVar15 = 0;
  uVar16 = 0;
  while( true ) {
    ppTVar10 = (this->torsionStamps_).
               super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppTVar14 = (this->torsionStamps_).
               super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppTVar14 - (long)ppTVar10 >> 3) <= uVar16) {
      uVar16 = 0;
      do {
        if ((ulong)((long)ppTVar14 - (long)ppTVar10 >> 3) <= uVar16) {
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &allTorsions._M_t._M_impl.super__Rb_tree_header._M_header;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar15 = 0;
          uVar16 = 0;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            if ((ulong)((long)ppTVar14 - (long)ppTVar10 >> 3) <= uVar16) {
              std::
              _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
              ::~_Rb_tree(&allTorsions._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
              return;
            }
            lVar4 = *(long *)((long)ppTVar10 + (lVar15 >> 0x1d));
            std::vector<int,_std::allocator<int>_>::vector
                      (&rigidSet,(vector<int,_std::allocator<int>_> *)(lVar4 + 0x98));
            if ((long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 0xc) {
              ghostIndex = *(int *)(lVar4 + 0x94);
              _Var7 = std::
                      __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                (rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&ghostIndex);
              if (_Var7._M_current !=
                  rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<int,_std::allocator<int>_>::insert
                          (&rigidSet,(const_iterator)_Var7._M_current,&ghostIndex);
              }
            }
            uVar1._0_4_ = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[2];
            uVar1._4_4_ = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[3];
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl = uVar1._0_4_;
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                 (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)uVar1._4_4_;
            _Var5.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                 (_Head_base<3UL,_int,_false>)
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[0];
            _Var5.super__Head_base<2UL,_int,_false>._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
            _M_head_impl = *rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
            if (uVar1._4_4_ <
                *rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
              local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_ = uVar1;
            }
            iVar11 = std::
                     _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                     ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                             *)&allTorsions,&local_1d8);
            if ((_Rb_tree_header *)iVar11._M_node != &allTorsions._M_t._M_impl.super__Rb_tree_header
               ) break;
            std::
            _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                        *)&allTorsions,&local_1d8);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
            uVar16 = uVar16 + 1;
            ppTVar10 = (this->torsionStamps_).
                       super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppTVar14 = (this->torsionStamps_).
                       super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            lVar15 = lVar15 + 0x100000000;
          }
          poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
          std::__cxx11::string::string((string *)&ghostIndex,(string *)&(this->Name).data_);
          poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
          poVar12 = std::operator<<(poVar12,": ");
          poVar12 = std::operator<<(poVar12,"Torsion");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((string *)&torsionAtoms,(OpenMD *)&rigidSet,cont_02);
          poVar12 = std::operator<<(poVar12,(string *)&torsionAtoms);
          std::operator<<(poVar12," appears multiple times\n");
          std::__cxx11::string::~string((string *)&torsionAtoms);
          std::__cxx11::string::~string((string *)&ghostIndex);
          pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar13,(string *)&ghostIndex);
          __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &torsionAtoms.super__Vector_base<int,_std::allocator<int>_>,
                   &ppTVar10[(int)uVar16]->members_);
        allTorsions._M_t._M_impl._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (value_type_conflict1 *)&allTorsions,(allocator_type *)&ghostIndex);
        piVar3 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar9 = torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar9 != torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
          lVar15 = (long)piVar3[*piVar9];
          if ((-1 < lVar15) &&
             (iVar2 = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15],
             rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar15] = iVar2 + 1, 2 < iVar2)) {
            poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
            std::__cxx11::string::string((string *)&allTorsions,(string *)&(this->Name).data_);
            poVar12 = std::operator<<(poVar12,(string *)&allTorsions);
            poVar12 = std::operator<<(poVar12,": torsion");
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)&ghostIndex,(OpenMD *)&torsionAtoms,cont);
            poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
            std::operator<<(poVar12,"has four atoms on the same rigid body\n");
            std::__cxx11::string::~string((string *)&ghostIndex);
            std::__cxx11::string::~string((string *)&allTorsions);
            pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar13,(string *)&allTorsions);
            __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&torsionAtoms.super__Vector_base<int,_std::allocator<int>_>);
        uVar16 = uVar16 + 1;
        ppTVar10 = (this->torsionStamps_).
                   super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppTVar14 = (this->torsionStamps_).
                   super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &torsionAtoms.super__Vector_base<int,_std::allocator<int>_>,
               (vector<int,_std::allocator<int>_> *)
               (*(long *)((long)ppTVar10 + (lVar15 >> 0x1d)) + 0x98));
    local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
         (((long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    _Var7 = std::
            find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1b8);
    local_1c0._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_int>.
    super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_int>)(_Tuple_impl<1UL,_int>)0x0;
    _Var8 = std::
            find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1c0);
    if ((_Var7._M_current !=
         torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) ||
       (_Var8._M_current !=
        torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) break;
    bVar6 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)
                       &torsionAtoms.super__Vector_base<int,_std::allocator<int>_>);
    if (bVar6) {
      poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
      std::__cxx11::string::string((string *)&allTorsions,(string *)&(this->Name).data_);
      poVar12 = std::operator<<(poVar12,(string *)&allTorsions);
      poVar12 = std::operator<<(poVar12," : atoms of torsion");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&ghostIndex,(OpenMD *)&torsionAtoms,cont_01);
      poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
      std::operator<<(poVar12," have duplicated indices\n");
      std::__cxx11::string::~string((string *)&ghostIndex);
      std::__cxx11::string::~string((string *)&allTorsions);
      pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar13,(string *)&allTorsions);
      __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&torsionAtoms.super__Vector_base<int,_std::allocator<int>_>);
    uVar16 = uVar16 + 1;
    lVar15 = lVar15 + 0x100000000;
  }
  poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
  std::__cxx11::string::string((string *)&allTorsions,(string *)&(this->Name).data_);
  poVar12 = std::operator<<(poVar12,(string *)&allTorsions);
  poVar12 = std::operator<<(poVar12,": atoms of torsion");
  containerToString<std::vector<int,std::allocator<int>>>
            ((string *)&ghostIndex,(OpenMD *)&torsionAtoms,cont_00);
  poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
  std::operator<<(poVar12," have invalid indices\n");
  std::__cxx11::string::~string((string *)&ghostIndex);
  std::__cxx11::string::~string((string *)&allTorsions);
  pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar13,(string *)&allTorsions);
  __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void FragmentStamp::checkTorsions() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int>::iterator j  = std::find_if(
          torsionAtoms.begin(), torsionAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != torsionAtoms.end() || k != torsionAtoms.end()) {
        oss << "Error in Fragment " << getName() << ": atoms of torsion"
            << containerToString(torsionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }
      if (hasDuplicateElement(torsionAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of torsion"
            << containerToString(torsionAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = torsionAtoms.begin(); j != torsionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Fragment " << getName() << ": torsion"
                << containerToString(torsionAtoms)
                << "has four atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allTorsions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp = getTorsionStamp(i);
      std::vector<int> torsion   = torsionStamp->getMembers();
      if (torsion.size() == 3) {
        int ghostIndex = torsionStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(torsion.begin(), torsion.end(), ghostIndex);
        if (j != torsion.end()) { torsion.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int, int> torsionTuple(torsion[0], torsion[1],
                                                  torsion[2], torsion[3]);
      auto& [first, second, third, fourth] = torsionTuple;

      if (first > fourth) {
        std::swap(first, fourth);
        std::swap(second, third);
      }

      iter = allTorsions.find(torsionTuple);
      if (iter == allTorsions.end()) {
        allTorsions.insert(torsionTuple);
      } else {
        oss << "Error in Fragment " << getName() << ": "
            << "Torsion" << containerToString(torsion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }
  }